

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiID IVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec2 IVar23;
  double dVar24;
  undefined4 uVar25;
  undefined1 in_register_00001204 [12];
  undefined4 uVar26;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar27;
  double dVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined1 local_e8 [16];
  undefined8 local_c8;
  ulong local_a0;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  double local_88;
  undefined8 uStack_80;
  char local_78 [72];
  
  pIVar5 = GImGui;
  local_e8._8_8_ = local_e8._0_8_;
  local_e8._4_4_ = in_register_00001204._0_4_;
  uVar25 = in_register_00001204._4_4_;
  uVar26 = in_register_00001204._8_4_;
  IVar6 = GImGui->ActiveId;
  if (IVar6 == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId == id) {
        cVar2 = GImGui->ActiveIdIsJustActivated;
        goto joined_r0x0018f1b9;
      }
    }
    else if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      cVar2 = (GImGui->IO).MouseDown[0];
joined_r0x0018f1b9:
      if (cVar2 == '\0') {
        GImGui->ActiveIdIsJustActivated = id != 0;
        if (id != 0) {
          pIVar5->ActiveIdTimer = 0.0;
        }
        IVar6 = 0;
        pIVar5->ActiveId = 0;
        pIVar5->ActiveIdAllowNavDirFlags = 0;
        pIVar5->ActiveIdAllowOverlap = false;
        pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
        goto LAB_0018f1f5;
      }
    }
  }
  else {
LAB_0018f1f5:
    if (IVar6 != id) {
      return false;
    }
  }
  switch(data_type) {
  case 0:
    if (v_min == (void *)0x0) {
      iVar16 = -0x80000000;
    }
    else {
      iVar16 = *v_min;
    }
    if (v_max == (void *)0x0) {
      iVar13 = 0x7fffffff;
    }
    else {
      iVar13 = *v_max;
    }
    fVar21 = 0.0;
    if (v_speed == 0.0 && iVar13 - iVar16 != 0) {
      v_speed = (float)(iVar13 - iVar16) * pIVar5->DragSpeedDefaultRatio;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar21 = IVar23.x;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (pIVar5->IO).MousePos.x)) && (-256000.0 <= (pIVar5->IO).MousePos.y)) &&
            (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])) {
      fVar21 = (pIVar5->IO).MouseDelta.x;
      if ((pIVar5->IO).KeyAlt != false) {
        fVar21 = fVar21 * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        fVar21 = fVar21 * 10.0;
      }
    }
    fVar21 = fVar21 * v_speed;
    if (iVar13 == iVar16) {
      bVar11 = false;
    }
    else {
      if ((iVar13 <= *v) && (0.0 < fVar21)) break;
      bVar11 = fVar21 < 0.0 && *v <= iVar16;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        fVar20 = pIVar5->DragCurrentAccum + fVar21;
        pIVar5->DragCurrentAccum = fVar20;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar20 = pIVar5->DragCurrentAccum;
      }
      iVar8 = *v;
      local_a0._0_4_ = (int)fVar20 + iVar8;
      while( true ) {
        cVar2 = *format;
        if (cVar2 == '\0') goto LAB_0019032d;
        if ((cVar2 == '%') && (format[1] != '%')) break;
        format = format + (ulong)(cVar2 == '%') + 1;
      }
      ImFormatString(local_78,0x40,format);
      pcVar15 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 == ' ');
      ImAtoi<int>(pcVar15,(int *)&local_a0);
      iVar8 = *v;
      fVar20 = pIVar5->DragCurrentAccum;
LAB_0019032d:
      pIVar5->DragCurrentAccumDirty = false;
      pIVar5->DragCurrentAccum = fVar20 - (float)(int)((uint)local_a0 - iVar8);
      if ((iVar13 != iVar16) && ((uint)local_a0 != iVar8)) {
        if (((int)(uint)local_a0 < iVar16) || ((iVar8 < (int)(uint)local_a0 && (fVar21 < 0.0)))) {
          local_a0._0_4_ = iVar16;
        }
        if ((iVar13 < (int)(uint)local_a0) || (((int)(uint)local_a0 < iVar8 && (0.0 < fVar21)))) {
          local_a0._0_4_ = iVar13;
        }
      }
      if (iVar8 == (uint)local_a0) {
        return false;
      }
      *(uint *)v = (uint)local_a0;
      return true;
    }
    break;
  case 1:
    if (v_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *v_min;
    }
    if (v_max == (void *)0x0) {
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = *v_max;
    }
    fVar21 = 0.0;
    if (v_speed == 0.0 && uVar14 - uVar7 != 0) {
      v_speed = (float)(uVar14 - uVar7) * pIVar5->DragSpeedDefaultRatio;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar21 = IVar23.x;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (pIVar5->IO).MousePos.x)) && (-256000.0 <= (pIVar5->IO).MousePos.y)) &&
            (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])) {
      fVar21 = (pIVar5->IO).MouseDelta.x;
      if ((pIVar5->IO).KeyAlt != false) {
        fVar21 = fVar21 * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        fVar21 = fVar21 * 10.0;
      }
    }
    fVar21 = fVar21 * v_speed;
    if (uVar14 == uVar7) {
      bVar11 = false;
    }
    else {
      if ((uVar14 <= *v) && (0.0 < fVar21)) break;
      bVar11 = fVar21 < 0.0 && *v <= uVar7;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        fVar20 = pIVar5->DragCurrentAccum + fVar21;
        pIVar5->DragCurrentAccum = fVar20;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar20 = pIVar5->DragCurrentAccum;
      }
      uVar9 = *v;
      local_a0._0_4_ = (int)(long)fVar20 + uVar9;
      while( true ) {
        cVar2 = *format;
        if (cVar2 == '\0') goto LAB_001903d1;
        if ((cVar2 == '%') && (format[1] != '%')) break;
        format = format + (ulong)(cVar2 == '%') + 1;
      }
      ImFormatString(local_78,0x40,format);
      pcVar15 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 == ' ');
      ImAtoi<int>(pcVar15,(int *)&local_a0);
      uVar9 = *v;
      fVar20 = pIVar5->DragCurrentAccum;
LAB_001903d1:
      pIVar5->DragCurrentAccumDirty = false;
      pIVar5->DragCurrentAccum = fVar20 - (float)(int)((uint)local_a0 - uVar9);
      if ((uVar14 != uVar7) && ((uint)local_a0 != uVar9)) {
        if (((uint)local_a0 < uVar7) || ((uVar9 < (uint)local_a0 && (fVar21 < 0.0)))) {
          local_a0._0_4_ = uVar7;
        }
        if ((uVar14 < (uint)local_a0) || (((uint)local_a0 < uVar9 && (0.0 < fVar21)))) {
          local_a0._0_4_ = uVar14;
        }
      }
      if (uVar9 == (uint)local_a0) {
        return false;
      }
      *(uint *)v = (uint)local_a0;
      return true;
    }
    break;
  case 2:
    uVar17 = 0x7fffffffffffffff;
    if (v_min == (void *)0x0) {
      uVar18 = 0x8000000000000000;
    }
    else {
      uVar18 = *v_min;
    }
    if (v_max != (void *)0x0) {
      uVar17 = *v_max;
    }
    fVar21 = 0.0;
    if (v_speed == 0.0 && uVar17 - uVar18 != 0) {
      v_speed = (float)(long)(uVar17 - uVar18) * pIVar5->DragSpeedDefaultRatio;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar21 = IVar23.x;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (pIVar5->IO).MousePos.x)) && (-256000.0 <= (pIVar5->IO).MousePos.y)) &&
            (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])) {
      fVar21 = (pIVar5->IO).MouseDelta.x;
      if ((pIVar5->IO).KeyAlt != false) {
        fVar21 = fVar21 * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        fVar21 = fVar21 * 10.0;
      }
    }
    fVar21 = fVar21 * v_speed;
    if (uVar17 == uVar18) {
      bVar11 = false;
    }
    else {
      if (((long)uVar17 <= *v) && (0.0 < fVar21)) break;
      bVar11 = fVar21 < 0.0 && *v <= (long)uVar18;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        fVar20 = pIVar5->DragCurrentAccum + fVar21;
        pIVar5->DragCurrentAccum = fVar20;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar20 = pIVar5->DragCurrentAccum;
      }
      uVar10 = *v;
      local_a0 = (long)fVar20 + uVar10;
      while( true ) {
        cVar2 = *format;
        if (cVar2 == '\0') goto LAB_001901d7;
        if ((cVar2 == '%') && (format[1] != '%')) break;
        format = format + (ulong)(cVar2 == '%') + 1;
      }
      ImFormatString(local_78,0x40,format);
      pcVar15 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 == ' ');
      ImAtoi<long_long>(pcVar15,(longlong *)&local_a0);
      uVar10 = *v;
      fVar20 = pIVar5->DragCurrentAccum;
LAB_001901d7:
      pIVar5->DragCurrentAccumDirty = false;
      pIVar5->DragCurrentAccum = fVar20 - (float)(long)(local_a0 - uVar10);
      if ((uVar17 == uVar18) || (local_a0 == uVar10)) goto LAB_001902d6;
      if (((long)local_a0 < (long)uVar18) || (((long)uVar10 < (long)local_a0 && (fVar21 < 0.0)))) {
        local_a0 = uVar18;
      }
      if ((long)local_a0 <= (long)uVar17) {
        if ((long)uVar10 <= (long)local_a0) goto LAB_001902d6;
LAB_001902cb:
        if (fVar21 <= 0.0) goto LAB_001902d6;
      }
LAB_001902d3:
      local_a0 = uVar17;
LAB_001902d6:
      if (uVar10 == local_a0) {
        return false;
      }
      *(ulong *)v = local_a0;
      return true;
    }
    break;
  case 3:
    if (v_min == (void *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = *v_min;
    }
    if (v_max == (void *)0x0) {
      uVar17 = 0xffffffffffffffff;
    }
    else {
      uVar17 = *v_max;
    }
    fVar21 = 0.0;
    if (v_speed == 0.0 && uVar17 - uVar18 != 0) {
      v_speed = (float)(uVar17 - uVar18) * pIVar5->DragSpeedDefaultRatio;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar21 = IVar23.x;
      if (v_speed <= 1.0) {
        v_speed = 1.0;
      }
    }
    else if ((((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
              (-256000.0 <= (pIVar5->IO).MousePos.x)) && (-256000.0 <= (pIVar5->IO).MousePos.y)) &&
            (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])) {
      fVar21 = (pIVar5->IO).MouseDelta.x;
      if ((pIVar5->IO).KeyAlt != false) {
        fVar21 = fVar21 * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        fVar21 = fVar21 * 10.0;
      }
    }
    fVar21 = fVar21 * v_speed;
    if (uVar17 == uVar18) {
      bVar11 = false;
    }
    else {
      if ((uVar17 <= *v) && (0.0 < fVar21)) break;
      bVar11 = fVar21 < 0.0 && *v <= uVar18;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar11)) {
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        fVar20 = pIVar5->DragCurrentAccum + fVar21;
        pIVar5->DragCurrentAccum = fVar20;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else {
        if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
          return false;
        }
        fVar20 = pIVar5->DragCurrentAccum;
      }
      uVar10 = *v;
      local_a0 = ((long)(fVar20 - 9.223372e+18) & (long)fVar20 >> 0x3f | (long)fVar20) + uVar10;
LAB_0018fbdd:
      cVar2 = *format;
      if (cVar2 != '\0') {
        if ((cVar2 != '%') || (format[1] == '%')) goto LAB_0018fbf8;
        ImFormatString(local_78,0x40,format);
        pcVar15 = (char *)((long)&uStack_80 + 7);
        do {
          pcVar1 = pcVar15 + 1;
          pcVar15 = pcVar15 + 1;
        } while (*pcVar1 == ' ');
        ImAtoi<long_long>(pcVar15,(longlong *)&local_a0);
        uVar10 = *v;
        fVar20 = pIVar5->DragCurrentAccum;
      }
      pIVar5->DragCurrentAccumDirty = false;
      pIVar5->DragCurrentAccum = fVar20 - (float)(long)(local_a0 - uVar10);
      if ((uVar17 == uVar18) || (local_a0 == uVar10)) goto LAB_001902d6;
      if ((local_a0 < uVar18) || ((uVar10 < local_a0 && (fVar21 < 0.0)))) {
        local_a0 = uVar18;
      }
      if (local_a0 <= uVar17) {
        if (uVar10 <= local_a0) goto LAB_001902d6;
        goto LAB_001902cb;
      }
      goto LAB_001902d3;
    }
    break;
  case 4:
    if (v_min == (void *)0x0) {
      fVar21 = -3.4028235e+38;
    }
    else {
      fVar21 = *v_min;
    }
    if (v_max == (void *)0x0) {
      fVar20 = 3.4028235e+38;
    }
    else {
      fVar20 = *v_max;
    }
    bVar11 = fVar21 != fVar20;
    bVar3 = fVar20 - fVar20 < 3.4028235e+38;
    local_98._0_4_ = 0.0;
    local_98._4_4_ = 0.0;
    uStack_90 = 0;
    uStack_8c = 0;
    if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar3 && bVar11)) {
      v_speed = (fVar20 - fVar21) * pIVar5->DragSpeedDefaultRatio;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar7 = ImParseFormatPrecision(format,3);
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      local_98._0_4_ = IVar23.x;
      local_98._4_4_ = IVar23.y;
      uStack_90 = (undefined4)extraout_XMM0_Qb;
      uStack_8c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
      if ((int)uVar7 < 0) {
        fVar19 = 1.1754944e-38;
      }
      else if (uVar7 < 10) {
        fVar19 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        local_98._0_4_ = IVar23.x;
        local_98._4_4_ = IVar23.y;
        fVar19 = powf(10.0,(float)(int)-uVar7);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar19 <= v_speed) |
                       ~-(uint)(fVar19 <= v_speed) & (uint)fVar19);
    }
    else if (((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
             (-256000.0 <= (pIVar5->IO).MousePos.x)) &&
            ((-256000.0 <= (pIVar5->IO).MousePos.y &&
             (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])))) {
      local_98._0_4_ = (pIVar5->IO).MouseDelta.x;
      local_98._4_4_ = 0.0;
      uStack_90 = 0;
      uStack_8c = 0;
      if ((pIVar5->IO).KeyAlt != false) {
        local_98._0_4_ = (float)local_98._0_4_ * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        local_98._0_4_ = (float)local_98._0_4_ * 10.0;
      }
    }
    local_98._0_4_ = (float)local_98._0_4_ * v_speed;
    if (bVar3 && bVar11) {
      if ((fVar20 <= *v) && (0.0 < (float)local_98._0_4_)) break;
      bVar12 = (float)local_98._0_4_ < 0.0 && *v <= fVar21;
    }
    else {
      bVar12 = false;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar12)) {
      if (((float)local_98._0_4_ != 0.0) || (NAN((float)local_98._0_4_))) {
        pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum + (float)local_98._0_4_;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      if (power != 1.0 && (bVar3 && bVar11)) {
        local_88 = (double)(ulong)(uint)(fVar20 - fVar21);
        uStack_80 = 0;
        fVar19 = powf((*v - fVar21) / (fVar20 - fVar21),1.0 / power);
        fVar22 = fVar19 + pIVar5->DragCurrentAccum / local_88._0_4_;
        fVar27 = 1.0;
        if (fVar22 <= 1.0) {
          fVar27 = fVar22;
        }
        fVar27 = powf((float)(~-(uint)(fVar22 < 0.0) & (uint)fVar27),power);
        fVar27 = fVar27 * local_88._0_4_ + fVar21;
      }
      else {
        fVar27 = *v + pIVar5->DragCurrentAccum;
        fVar19 = 0.0;
      }
      while( true ) {
        cVar2 = *format;
        if (cVar2 == '\0') goto LAB_001900c4;
        if ((cVar2 == '%') && (format[1] != '%')) break;
        format = format + (ulong)(cVar2 == '%') + 1;
      }
      ImFormatString(local_78,0x40,format,(double)fVar27);
      pcVar15 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 == ' ');
      dVar28 = atof(pcVar15);
      fVar27 = (float)dVar28;
LAB_001900c4:
      pIVar5->DragCurrentAccumDirty = false;
      if (power != 1.0 && (bVar3 && bVar11)) {
        fVar22 = powf((fVar27 - fVar21) / (fVar20 - fVar21),1.0 / power);
        fVar22 = fVar22 - fVar19;
      }
      else {
        fVar22 = fVar27 - *v;
      }
      pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - fVar22;
      fVar27 = (float)(~-(uint)(fVar27 == 0.0) & (uint)fVar27);
      fVar19 = *v;
      if ((bVar3 && bVar11) && fVar27 != fVar19) {
        if ((fVar27 < fVar21) || ((fVar19 < fVar27 && ((float)local_98._0_4_ < 0.0)))) {
          fVar27 = fVar21;
        }
        if ((fVar20 < fVar27) || ((fVar27 < fVar19 && (0.0 < (float)local_98._0_4_)))) {
          fVar27 = fVar20;
        }
      }
      if ((fVar19 == fVar27) && (!NAN(fVar19) && !NAN(fVar27))) {
        return false;
      }
      *(float *)v = fVar27;
      return true;
    }
    break;
  case 5:
    if (v_min == (void *)0x0) {
      uVar31 = 0xffffffff;
      uVar32 = 0xffefffff;
    }
    else {
      uVar31 = (undefined4)*v_min;
      uVar32 = (undefined4)((ulong)*v_min >> 0x20);
    }
    if (v_max == (void *)0x0) {
      uVar29 = 0xffffffff;
      uVar30 = 0x7fefffff;
    }
    else {
      uVar29 = (undefined4)*v_max;
      uVar30 = (undefined4)((ulong)*v_max >> 0x20);
    }
    bVar11 = (double)CONCAT44(uVar32,uVar31) != (double)CONCAT44(uVar30,uVar29);
    bVar3 = (double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar30,uVar29) <
            3.4028234663852886e+38;
    local_98._0_4_ = 0.0;
    local_98._4_4_ = 0.0;
    uStack_90 = 0;
    uStack_8c = 0;
    if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar3 && bVar11)) {
      v_speed = (float)((double)pIVar5->DragSpeedDefaultRatio *
                       ((double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar32,uVar31)));
      local_e8._4_4_ = 0;
      uVar25 = 0;
      uVar26 = 0;
    }
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
      local_e8._0_4_ = v_speed;
      local_e8._8_4_ = uVar25;
      local_e8._12_4_ = uVar26;
      uVar7 = ImParseFormatPrecision(format,3);
      IVar23 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      local_98._0_4_ = IVar23.x;
      local_98._4_4_ = IVar23.y;
      uStack_90 = (undefined4)extraout_XMM0_Qb_00;
      uStack_8c = (undefined4)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      if ((int)uVar7 < 0) {
        fVar21 = 1.1754944e-38;
      }
      else if (uVar7 < 10) {
        fVar21 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        local_98._0_4_ = IVar23.x;
        local_98._4_4_ = IVar23.y;
        fVar21 = powf(10.0,(float)(int)-uVar7);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar21 <= v_speed) |
                       ~-(uint)(fVar21 <= v_speed) & (uint)fVar21);
    }
    else if (((pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) &&
             (-256000.0 <= (pIVar5->IO).MousePos.x)) &&
            ((-256000.0 <= (pIVar5->IO).MousePos.y &&
             (1.0 < (pIVar5->IO).MouseDragMaxDistanceSqr[0])))) {
      local_98._0_4_ = (pIVar5->IO).MouseDelta.x;
      local_98._4_4_ = 0.0;
      uStack_90 = 0;
      uStack_8c = 0;
      if ((pIVar5->IO).KeyAlt != false) {
        local_98._0_4_ = (float)local_98._0_4_ * 0.01;
      }
      if ((pIVar5->IO).KeyShift == true) {
        local_98._0_4_ = (float)local_98._0_4_ * 10.0;
      }
    }
    local_98._0_4_ = (float)local_98._0_4_ * v_speed;
    if (bVar3 && bVar11) {
      if (((double)CONCAT44(uVar30,uVar29) <= *v) && (0.0 < (float)local_98._0_4_)) break;
      bVar12 = (float)local_98._0_4_ < 0.0 && *v <= (double)CONCAT44(uVar32,uVar31);
    }
    else {
      bVar12 = false;
    }
    if ((pIVar5->ActiveIdIsJustActivated == false) && (!bVar12)) {
      if (((float)local_98._0_4_ != 0.0) || (NAN((float)local_98._0_4_))) {
        pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum + (float)local_98._0_4_;
        pIVar5->DragCurrentAccumDirty = true;
      }
      else if ((pIVar5->DragCurrentAccumDirty & 1U) == 0) {
        return false;
      }
      local_c8 = (double)CONCAT44(uVar32,uVar31);
      if (power != 1.0 && (bVar3 && bVar11)) {
        uStack_80 = 0;
        local_88 = (double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar32,uVar31);
        local_e8._0_8_ = pow((*v - (double)CONCAT44(uVar32,uVar31)) / local_88,1.0 / (double)power);
        fVar20 = (float)((double)pIVar5->DragCurrentAccum / local_88 + (double)local_e8._0_8_);
        fVar21 = 1.0;
        if (fVar20 <= 1.0) {
          fVar21 = fVar20;
        }
        fVar21 = powf((float)(~-(uint)(fVar20 < 0.0) & (uint)fVar21),power);
        dVar28 = (double)fVar21 * local_88 + local_c8;
      }
      else {
        dVar28 = *v + (double)pIVar5->DragCurrentAccum;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_e8._8_8_;
        local_e8 = auVar4 << 0x40;
      }
      while( true ) {
        cVar2 = *format;
        if (cVar2 == '\0') goto LAB_00190475;
        if ((cVar2 == '%') && (format[1] != '%')) break;
        format = format + (ulong)(cVar2 == '%') + 1;
      }
      ImFormatString(local_78,0x40,format,dVar28);
      pcVar15 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar15 + 1;
        pcVar15 = pcVar15 + 1;
      } while (*pcVar1 == ' ');
      dVar28 = atof(pcVar15);
LAB_00190475:
      pIVar5->DragCurrentAccumDirty = false;
      if (power != 1.0 && (bVar3 && bVar11)) {
        dVar24 = pow((dVar28 - (double)CONCAT44(uVar32,uVar31)) /
                     ((double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar32,uVar31)),
                     1.0 / (double)power);
        pIVar5->DragCurrentAccum =
             pIVar5->DragCurrentAccum - (float)(dVar24 - (double)local_e8._0_8_);
        dVar24 = *v;
      }
      else {
        dVar24 = *v;
        pIVar5->DragCurrentAccum = pIVar5->DragCurrentAccum - (float)(dVar28 - dVar24);
      }
      dVar28 = (double)(~-(ulong)(dVar28 == 0.0) & (ulong)dVar28);
      uVar25 = SUB84(dVar28,0);
      uVar26 = (undefined4)((ulong)dVar28 >> 0x20);
      if ((bVar3 && bVar11) && dVar24 != dVar28) {
        if ((dVar28 < local_c8) || ((dVar24 < dVar28 && ((float)local_98._0_4_ < 0.0)))) {
          uVar25 = uVar31;
          uVar26 = uVar32;
        }
        if (((double)CONCAT44(uVar30,uVar29) <= (double)CONCAT44(uVar26,uVar25) &&
             (double)CONCAT44(uVar26,uVar25) != (double)CONCAT44(uVar30,uVar29)) ||
           (((double)CONCAT44(uVar26,uVar25) <= dVar24 && dVar24 != (double)CONCAT44(uVar26,uVar25)
            && (0.0 < (float)local_98._0_4_)))) {
          uVar25 = uVar29;
          uVar26 = uVar30;
        }
      }
      if ((dVar24 == (double)CONCAT44(uVar26,uVar25)) &&
         (!NAN(dVar24) && !NAN((double)CONCAT44(uVar26,uVar25)))) {
        return false;
      }
      *(ulong *)v = CONCAT44(uVar26,uVar25);
      return true;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x24c0,
                  "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                 );
  }
  pIVar5->DragCurrentAccum = 0.0;
  pIVar5->DragCurrentAccumDirty = false;
  return false;
LAB_0018fbf8:
  format = format + (ulong)(cVar2 == '%') + 1;
  goto LAB_0018fbdd;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}